

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_device_post_init(ma_device *pDevice,ma_device_type deviceType,
                             ma_device_descriptor *pDescriptorPlayback,
                             ma_device_descriptor *pDescriptorCapture)

{
  uint uVar1;
  ma_channel *pmVar2;
  void **ppvVar3;
  ma_uint32 mVar4;
  ma_uint32 mVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar12;
  undefined4 uVar13;
  _func_void_void_ptr_void_ptr *p_Var8;
  ma_resampling_backend_vtable *pmVar9;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *p_Var10;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var11;
  char cVar14;
  ma_channel mVar15;
  uint uVar16;
  ma_result mVar17;
  ma_result mVar18;
  char *pcVar19;
  ma_uint64 mVar20;
  void *pvVar21;
  ma_context *pmVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  ma_device_info_conflict deviceInfo;
  ma_device_id_conflict local_638;
  char acStack_538 [1288];
  
  if (pDevice == (ma_device *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar1 = deviceType - ma_device_type_capture;
  if (uVar1 < 3) {
    if (pDescriptorCapture == (ma_device_descriptor *)0x0) {
      return MA_INVALID_ARGS;
    }
    if (pDescriptorCapture->format == ma_format_unknown) {
      return MA_INVALID_ARGS;
    }
    mVar4 = pDescriptorCapture->channels;
    if (mVar4 - 0xff < 0xffffff02) {
      return MA_INVALID_ARGS;
    }
    mVar5 = pDescriptorCapture->sampleRate;
    if (mVar5 == 0) {
      return MA_INVALID_ARGS;
    }
    (pDevice->capture).internalFormat = pDescriptorCapture->format;
    (pDevice->capture).internalChannels = mVar4;
    (pDevice->capture).internalSampleRate = mVar5;
    memcpy((pDevice->capture).internalChannelMap,pDescriptorCapture->channelMap,0xfe);
    mVar4 = pDescriptorCapture->periodSizeInFrames;
    (pDevice->capture).internalPeriodSizeInFrames = mVar4;
    (pDevice->capture).internalPeriods = pDescriptorCapture->periodCount;
    if (mVar4 == 0) {
      if (pDescriptorCapture->sampleRate == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = (pDescriptorCapture->sampleRate * pDescriptorCapture->periodSizeInMilliseconds) /
                 1000;
      }
      (pDevice->capture).internalPeriodSizeInFrames = uVar16;
    }
  }
  if ((deviceType & ~ma_device_type_capture) == ma_device_type_playback) {
    if (pDescriptorPlayback == (ma_device_descriptor *)0x0) {
      return MA_INVALID_ARGS;
    }
    if (pDescriptorPlayback->format == ma_format_unknown) {
      return MA_INVALID_ARGS;
    }
    mVar4 = pDescriptorPlayback->channels;
    if (mVar4 - 0xff < 0xffffff02) {
      return MA_INVALID_ARGS;
    }
    mVar5 = pDescriptorPlayback->sampleRate;
    if (mVar5 == 0) {
      return MA_INVALID_ARGS;
    }
    (pDevice->playback).internalFormat = pDescriptorPlayback->format;
    (pDevice->playback).internalChannels = mVar4;
    (pDevice->playback).internalSampleRate = mVar5;
    memcpy((pDevice->playback).internalChannelMap,pDescriptorPlayback->channelMap,0xfe);
    mVar4 = pDescriptorPlayback->periodSizeInFrames;
    (pDevice->playback).internalPeriodSizeInFrames = mVar4;
    (pDevice->playback).internalPeriods = pDescriptorPlayback->periodCount;
    if (mVar4 == 0) {
      if (pDescriptorPlayback->sampleRate == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = (pDescriptorPlayback->sampleRate * pDescriptorPlayback->periodSizeInMilliseconds) /
                 1000;
      }
      (pDevice->playback).internalPeriodSizeInFrames = uVar16;
    }
  }
  if (uVar1 < 3) {
    mVar17 = ma_device_get_info(pDevice,(deviceType != ma_device_type_loopback) +
                                        ma_device_type_playback,
                                (ma_device_info_conflict *)&local_638);
    if (mVar17 == MA_SUCCESS) {
      lVar23 = 0;
      do {
        if (acStack_538[lVar23] == '\0') goto LAB_00190f64;
        (pDevice->capture).name[lVar23] = acStack_538[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0xff);
      lVar23 = 0xff;
LAB_00190f64:
      pcVar19 = (pDevice->capture).name + lVar23;
    }
    else if (pDescriptorCapture->pDeviceID == (ma_device_id *)0x0) {
      cVar14 = 'D';
      lVar23 = 0;
      do {
        (pDevice->capture).name[lVar23] = cVar14;
        cVar14 = "Default Capture Device"[lVar23 + 1];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x16);
      pcVar19 = (pDevice->capture).name + 0x16;
    }
    else {
      cVar14 = 'C';
      lVar23 = 0;
      do {
        (pDevice->capture).name[lVar23] = cVar14;
        cVar14 = "NULL Capture Device"[lVar23 + 6];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0xe);
      pcVar19 = (pDevice->capture).name + 0xe;
    }
    *pcVar19 = '\0';
  }
  if ((deviceType & ~ma_device_type_capture) == ma_device_type_playback) {
    mVar17 = ma_device_get_info(pDevice,ma_device_type_playback,
                                (ma_device_info_conflict *)&local_638);
    if (mVar17 == MA_SUCCESS) {
      lVar23 = 0;
      do {
        if (acStack_538[lVar23] == '\0') goto LAB_0019100e;
        (pDevice->playback).name[lVar23] = acStack_538[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0xff);
      lVar23 = 0xff;
LAB_0019100e:
      pcVar19 = (pDevice->playback).name + lVar23;
    }
    else if (pDescriptorPlayback->pDeviceID == (ma_device_id *)0x0) {
      cVar14 = 'D';
      lVar23 = 0;
      do {
        (pDevice->playback).name[lVar23] = cVar14;
        cVar14 = "Default Playback Device"[lVar23 + 1];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x17);
      pcVar19 = (pDevice->playback).name + 0x17;
    }
    else {
      cVar14 = 'P';
      lVar23 = 0;
      do {
        (pDevice->playback).name[lVar23] = cVar14;
        cVar14 = "NULL Playback Device"[lVar23 + 6];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0xf);
      pcVar19 = (pDevice->playback).name + 0xf;
    }
    *pcVar19 = '\0';
  }
  if (uVar1 < 3) {
    if ((pDevice->capture).format == ma_format_unknown) {
      (pDevice->capture).format = (pDevice->capture).internalFormat;
    }
    uVar16 = (pDevice->capture).channels;
    if (uVar16 == 0) {
      uVar16 = (pDevice->capture).internalChannels;
      (pDevice->capture).channels = uVar16;
    }
    if ((pDevice->capture).channelMap[0] == '\0') {
      if (0xfe < uVar16) {
        __assert_fail("pDevice->capture.channels <= 254",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x6d85,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)");
      }
      pmVar2 = (pDevice->capture).channelMap;
      if ((pDevice->capture).internalChannels == uVar16) {
        if (uVar16 != 0) {
          memcpy(pmVar2,(pDevice->capture).internalChannelMap,(ulong)uVar16);
        }
      }
      else if ((pDevice->capture).channelMixMode == ma_channel_mix_mode_simple) {
        if (uVar16 != 0) {
          memset(pmVar2,0,(ulong)uVar16);
        }
      }
      else if (uVar16 != 0) {
        lVar23 = 0;
        do {
          mVar15 = ma_channel_map_init_standard_channel
                             (ma_standard_channel_map_default,uVar16,(ma_uint32)lVar23);
          pmVar2[lVar23] = mVar15;
          if (uVar16 <= (uint)(lVar23 + 1)) break;
          bVar25 = lVar23 != 0xfd;
          lVar23 = lVar23 + 1;
        } while (bVar25);
      }
    }
    if ((deviceType | ma_device_type_capture) == ma_device_type_duplex) {
LAB_00191094:
      if ((pDevice->playback).format == ma_format_unknown) {
        (pDevice->playback).format = (pDevice->playback).internalFormat;
      }
      uVar16 = (pDevice->playback).channels;
      if (uVar16 == 0) {
        uVar16 = (pDevice->playback).internalChannels;
        (pDevice->playback).channels = uVar16;
      }
      if ((pDevice->playback).channelMap[0] == '\0') {
        if (0xfe < uVar16) {
          __assert_fail("pDevice->playback.channels <= 254",
                        "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                        ,0x6d9a,"ma_result ma_device__post_init_setup(ma_device *, ma_device_type)")
          ;
        }
        pmVar2 = (pDevice->playback).channelMap;
        if ((pDevice->playback).internalChannels == uVar16) {
          if (uVar16 != 0) {
            memcpy(pmVar2,(pDevice->playback).internalChannelMap,(ulong)uVar16);
          }
        }
        else if ((pDevice->playback).channelMixMode == ma_channel_mix_mode_simple) {
          if (uVar16 != 0) {
            memset(pmVar2,0,(ulong)uVar16);
          }
        }
        else if (uVar16 != 0) {
          lVar23 = 0;
          do {
            mVar15 = ma_channel_map_init_standard_channel
                               (ma_standard_channel_map_default,uVar16,(ma_uint32)lVar23);
            pmVar2[lVar23] = mVar15;
            if (uVar16 <= (uint)(lVar23 + 1)) break;
            bVar25 = lVar23 != 0xfd;
            lVar23 = lVar23 + 1;
          } while (bVar25);
        }
      }
    }
  }
  else if (deviceType == ma_device_type_playback) goto LAB_00191094;
  local_638.wasapi[5] = pDevice->sampleRate;
  if (local_638.wasapi[5] == L'\0') {
    if (uVar1 < 3) {
      local_638.wasapi[5] = (pDevice->capture).internalSampleRate;
      pDevice->sampleRate = local_638.wasapi[5];
      local_638.wasapi[4] = local_638.wasapi[5];
      goto LAB_001910fa;
    }
    pDevice->sampleRate = (pDevice->playback).internalSampleRate;
  }
  else if (uVar1 < 3) {
    local_638.wasapi[4] = (pDevice->capture).internalSampleRate;
LAB_001910fa:
    local_638._72_8_ = 0;
    local_638._80_8_ = 0;
    local_638._56_8_ = 0;
    local_638._64_8_ = 0;
    local_638.wasapi[10] = L'\0';
    local_638.wasapi[0xd] = L'\0';
    local_638.wasapi[2] = (pDevice->capture).internalChannels;
    local_638._24_8_ = (pDevice->capture).internalChannelMap;
    local_638.wasapi[1] = (pDevice->capture).format;
    local_638.wasapi[0] = (pDevice->capture).internalFormat;
    local_638.wasapi[3] = (pDevice->capture).channels;
    local_638._32_8_ = (pDevice->capture).channelMap;
    uVar6 = (pDevice->capture).channelMixMode;
    uVar12 = (pDevice->capture).calculateLFEFromSpatialChannels;
    local_638.wasapi[0x17] = 0;
    local_638.wasapi[0x16] = (pDevice->resampling).algorithm;
    local_638.wasapi[0x1d] = 0;
    local_638.wasapi[0x1c] = (pDevice->resampling).linear.lpfOrder;
    local_638._96_8_ = (pDevice->resampling).pBackendVTable;
    local_638._104_8_ = (pDevice->resampling).pBackendUserData;
    local_638.wasapi[0xb] = uVar6;
    local_638.wasapi[0xc] = uVar12;
    if (pDevice->state != ma_device_state_uninitialized) {
      ma_data_converter_uninit
                (&(pDevice->capture).converter,&pDevice->pContext->allocationCallbacks);
    }
    mVar17 = ma_data_converter_init
                       ((ma_data_converter_config *)&local_638,
                        &pDevice->pContext->allocationCallbacks,&(pDevice->capture).converter);
    if (mVar17 != MA_SUCCESS) {
      return mVar17;
    }
  }
  mVar17 = MA_SUCCESS;
  if ((deviceType | ma_device_type_capture) != ma_device_type_duplex) {
    return MA_SUCCESS;
  }
  local_638._72_8_ = 0;
  local_638._80_8_ = 0;
  local_638._56_8_ = 0;
  local_638._64_8_ = 0;
  local_638.wasapi[10] = L'\0';
  local_638.wasapi[0xd] = L'\0';
  local_638.wasapi[2] = (pDevice->playback).channels;
  local_638.wasapi[4] = pDevice->sampleRate;
  local_638._24_8_ = (pDevice->playback).channelMap;
  local_638.wasapi[1] = (pDevice->playback).internalFormat;
  local_638.wasapi[0] = (pDevice->playback).format;
  local_638.wasapi[3] = (pDevice->playback).internalChannels;
  local_638.wasapi[5] = (pDevice->playback).internalSampleRate;
  local_638._32_8_ = (pDevice->playback).internalChannelMap;
  uVar7 = (pDevice->playback).channelMixMode;
  uVar13 = (pDevice->playback).calculateLFEFromSpatialChannels;
  local_638.wasapi[0x17] = 0;
  local_638.wasapi[0x16] = (pDevice->resampling).algorithm;
  local_638.wasapi[0x1d] = 0;
  local_638.wasapi[0x1c] = (pDevice->resampling).linear.lpfOrder;
  local_638._96_8_ = (pDevice->resampling).pBackendVTable;
  local_638._104_8_ = (pDevice->resampling).pBackendUserData;
  local_638.wasapi[0xb] = uVar7;
  local_638.wasapi[0xc] = uVar13;
  if (pDevice->state != ma_device_state_uninitialized) {
    ma_data_converter_uninit(&(pDevice->playback).converter,&pDevice->pContext->allocationCallbacks)
    ;
  }
  mVar18 = ma_data_converter_init
                     ((ma_data_converter_config *)&local_638,&pDevice->pContext->allocationCallbacks
                      ,&(pDevice->playback).converter);
  if (mVar18 != MA_SUCCESS) {
    return mVar18;
  }
  (pDevice->playback).inputCacheConsumed = 0;
  (pDevice->playback).inputCacheRemaining = 0;
  if (deviceType == ma_device_type_duplex) {
LAB_0019135c:
    mVar20 = ma_calculate_frame_count_after_resampling
                       ((pDevice->playback).internalSampleRate,pDevice->sampleRate,
                        (ulong)(pDevice->playback).internalPeriodSizeInFrames);
    uVar24 = ((&DAT_001be730)[(pDevice->playback).format] * (pDevice->playback).channels) * mVar20;
    ppvVar3 = &(pDevice->playback).pInputCache;
    if (uVar24 >> 0x20 == 0) {
      pmVar22 = pDevice->pContext;
      p_Var11 = (pmVar22->allocationCallbacks).onRealloc;
      if (p_Var11 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        pvVar21 = (*p_Var11)(*ppvVar3,uVar24,(pmVar22->allocationCallbacks).pUserData);
        if (pvVar21 != (void *)0x0) {
          (pDevice->playback).pInputCache = pvVar21;
          (pDevice->playback).inputCacheCap = mVar20;
          return MA_SUCCESS;
        }
        pmVar22 = pDevice->pContext;
      }
      if ((*ppvVar3 != (void *)0x0) &&
         (p_Var8 = (pmVar22->allocationCallbacks).onFree,
         p_Var8 != (_func_void_void_ptr_void_ptr *)0x0)) {
        (*p_Var8)(*ppvVar3,(pmVar22->allocationCallbacks).pUserData);
      }
    }
    else {
      pvVar21 = (pDevice->playback).pInputCache;
      if (pvVar21 != (void *)0x0) {
        p_Var8 = (pDevice->pContext->allocationCallbacks).onFree;
        if (p_Var8 != (_func_void_void_ptr_void_ptr *)0x0) {
          (*p_Var8)(pvVar21,(pDevice->pContext->allocationCallbacks).pUserData);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    (pDevice->playback).inputCacheCap = 0;
    mVar17 = MA_OUT_OF_MEMORY;
  }
  else {
    local_638.custom.p = (void *)0x0;
    if ((pDevice->playback).converter.hasResampler == '\0') {
      local_638.custom.p = (void *)0x1;
    }
    else {
      pmVar9 = (pDevice->playback).converter.resampler.pBackendVTable;
      if (((pmVar9 == (ma_resampling_backend_vtable *)0x0) ||
          (p_Var10 = pmVar9->onGetRequiredInputFrameCount,
          p_Var10 ==
          (_func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *)0x0)) ||
         (mVar18 = (*p_Var10)((pDevice->playback).converter.resampler.pBackendUserData,
                              (pDevice->playback).converter.resampler.pBackend,1,
                              (ma_uint64 *)local_638.dsound), mVar18 != MA_SUCCESS))
      goto LAB_0019135c;
    }
    pvVar21 = (pDevice->playback).pInputCache;
    if (pvVar21 != (void *)0x0) {
      p_Var8 = (pDevice->pContext->allocationCallbacks).onFree;
      if (p_Var8 != (_func_void_void_ptr_void_ptr *)0x0) {
        (*p_Var8)(pvVar21,(pDevice->pContext->allocationCallbacks).pUserData);
      }
    }
    (pDevice->playback).pInputCache = (void *)0x0;
    (pDevice->playback).inputCacheCap = 0;
  }
  return mVar17;
}

Assistant:

MA_API ma_result ma_device_post_init(ma_device* pDevice, ma_device_type deviceType, const ma_device_descriptor* pDescriptorPlayback, const ma_device_descriptor* pDescriptorCapture)
{
    ma_result result;

    if (pDevice == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Capture. */
    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        if (ma_device_descriptor_is_valid(pDescriptorCapture) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->capture.internalFormat             = pDescriptorCapture->format;
        pDevice->capture.internalChannels           = pDescriptorCapture->channels;
        pDevice->capture.internalSampleRate         = pDescriptorCapture->sampleRate;
        MA_COPY_MEMORY(pDevice->capture.internalChannelMap, pDescriptorCapture->channelMap, sizeof(pDescriptorCapture->channelMap));
        pDevice->capture.internalPeriodSizeInFrames = pDescriptorCapture->periodSizeInFrames;
        pDevice->capture.internalPeriods            = pDescriptorCapture->periodCount;

        if (pDevice->capture.internalPeriodSizeInFrames == 0) {
            pDevice->capture.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorCapture->periodSizeInMilliseconds, pDescriptorCapture->sampleRate);
        }
    }

    /* Playback. */
    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        if (ma_device_descriptor_is_valid(pDescriptorPlayback) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->playback.internalFormat             = pDescriptorPlayback->format;
        pDevice->playback.internalChannels           = pDescriptorPlayback->channels;
        pDevice->playback.internalSampleRate         = pDescriptorPlayback->sampleRate;
        MA_COPY_MEMORY(pDevice->playback.internalChannelMap, pDescriptorPlayback->channelMap, sizeof(pDescriptorPlayback->channelMap));
        pDevice->playback.internalPeriodSizeInFrames = pDescriptorPlayback->periodSizeInFrames;
        pDevice->playback.internalPeriods            = pDescriptorPlayback->periodCount;

        if (pDevice->playback.internalPeriodSizeInFrames == 0) {
            pDevice->playback.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorPlayback->periodSizeInMilliseconds, pDescriptorPlayback->sampleRate);
        }
    }

    /*
    The name of the device can be retrieved from device info. This may be temporary and replaced with a `ma_device_get_info(pDevice, deviceType)` instead.
    For loopback devices, we need to retrieve the name of the playback device.
    */
    {
        ma_device_info deviceInfo;

        if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
            result = ma_device_get_info(pDevice, (deviceType == ma_device_type_loopback) ? ma_device_type_playback : ma_device_type_capture, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorCapture->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), "Capture Device", (size_t)-1);
                }
            }
        }

        if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
            result = ma_device_get_info(pDevice, ma_device_type_playback, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorPlayback->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), "Playback Device", (size_t)-1);
                }
            }
        }
    }

    /* Update data conversion. */
    return ma_device__post_init_setup(pDevice, deviceType); /* TODO: Should probably rename ma_device__post_init_setup() to something better. */
}